

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O3

wchar_t archive_acl_from_text_w(archive_acl *acl,wchar_t *text,wchar_t want_type)

{
  uint *puVar1;
  int *piVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  wchar_t wVar6;
  ulong uVar7;
  long lVar8;
  wchar_t *pwVar9;
  int *piVar10;
  uint *puVar11;
  uint uVar12;
  wchar_t wVar13;
  wchar_t wVar14;
  wchar_t wVar15;
  ulong uVar16;
  wchar_t *pwVar17;
  wchar_t *pwVar18;
  wchar_t wVar19;
  wchar_t wVar20;
  ulong uVar21;
  ulong uVar22;
  anon_struct_16_2_267fbce2 field [6];
  wchar_t local_e0;
  wchar_t local_dc;
  wchar_t *local_d8;
  wchar_t *local_d0;
  wchar_t *local_c8;
  wchar_t local_bc;
  wchar_t local_b8;
  uint local_b4;
  ulong local_b0;
  archive_acl *local_a8;
  long local_a0;
  wchar_t *local_98;
  long local_90;
  wchar_t *local_88 [5];
  long alStack_60 [6];
  
  local_b4 = 5;
  if (want_type < L'̀') {
    if ((want_type != L'Ā') && (want_type != L'Ȁ')) {
      return L'\xffffffe2';
    }
  }
  else if (want_type == L'㰀') {
    local_b4 = 6;
  }
  else {
    if (want_type != L'̀') {
      return L'\xffffffe2';
    }
    want_type = L'Ā';
  }
  wVar19 = L'\0';
  local_a8 = acl;
  if (text == (wchar_t *)0x0) {
    local_bc = L'\0';
  }
  else {
    local_bc = L'\0';
    local_b8 = want_type;
    if (*text != L'\0') {
      uVar21 = (ulong)local_b4;
      local_a0 = uVar21 + 0xfffffffe;
      local_b0 = 0;
      local_bc = L'\0';
LAB_0011437a:
      uVar7 = 0;
      do {
        while ((uVar22 = uVar7, uVar7 = (ulong)(uint)*text, uVar7 < 0x21 &&
               ((0x100000600U >> (uVar7 & 0x3f) & 1) != 0))) {
          text = text + 1;
          uVar7 = uVar22;
        }
        uVar16 = 0;
        while ((uVar3 = (uint)uVar7, 0x3a < uVar3 ||
               ((0x400100800000401U >> (uVar7 & 0x3f) & 1) == 0))) {
          lVar8 = uVar16 + 4;
          uVar16 = uVar16 + 4;
          uVar7 = (ulong)*(uint *)((long)text + lVar8);
        }
        pwVar17 = (wchar_t *)((long)text + uVar16);
        pwVar9 = text;
        for (pwVar18 = pwVar17; (uVar16 != 0 && (pwVar9 = pwVar18, (ulong)(uint)pwVar18[-1] < 0x21))
            ; pwVar18 = pwVar18 + -1) {
          uVar16 = 0x100000600U >> ((ulong)(uint)pwVar18[-1] & 0x3f) & 1;
        }
        if (uVar3 == 0x23) {
          uVar7 = 0x23;
          while ((uVar3 = (uint)uVar7, 0x2c < uVar3 ||
                 ((0x100000000401U >> (uVar7 & 0x3f) & 1) == 0))) {
            pwVar18 = pwVar17 + 1;
            pwVar17 = pwVar17 + 1;
            uVar7 = (ulong)(uint)*pwVar18;
          }
        }
        if (uVar22 < uVar21) {
          (&local_98)[uVar22 * 2] = text;
          (&local_90)[uVar22 * 2] = (long)pwVar9;
        }
        text = pwVar17 + (uVar3 != 0);
        uVar7 = uVar22 + 1;
      } while (uVar3 == 0x3a);
      uVar3 = (uint)uVar22;
      if ((uint)(uVar22 + 1) < local_b4) {
        memset(local_88 + uVar22 * 2,0,(ulong)((int)local_a0 - uVar3) * 0x10 + 0x10);
      }
      pwVar17 = local_98;
      if ((local_98 != (wchar_t *)0x0) && (*local_98 == L'#')) {
        uVar7 = local_b0 & 0xffffffff;
        goto LAB_00114d7b;
      }
      uVar22 = local_90 - (long)local_98;
      local_e0 = L'\0';
      if (local_b8 == L'㰀') {
        uVar7 = 0xffffffec;
        switch((long)uVar22 >> 2) {
        case 4:
          iVar4 = wmemcmp(local_98,anon_var_dwarf_f2,4);
          if (iVar4 == 0) {
            wVar19 = L'✑';
LAB_00114757:
            iVar4 = 1;
            pwVar17 = local_88[1];
            pwVar18 = local_88[0];
            wVar6 = L'\xffffffff';
            if (local_88[0] < local_88[1]) {
              wVar20 = L'\0';
              pwVar9 = local_88[0];
              do {
                wVar13 = *pwVar9;
                wVar6 = L'\xffffffff';
                if ((uint)(wVar13 + L'\xffffffc6') < 0xfffffff6) break;
                wVar6 = L'\x7fffffff';
                if ((wVar20 < L'\x0ccccccd') && ((wVar20 != L'\x0ccccccc' || ((uint)wVar13 < 0x38)))
                   ) {
                  wVar6 = wVar13 + wVar20 * 10 + L'\xffffffd0';
                }
                wVar20 = wVar6;
                pwVar9 = pwVar9 + 1;
                wVar6 = wVar20;
              } while (pwVar9 < local_88[1]);
            }
            goto LAB_00114971;
          }
          break;
        case 5:
          iVar4 = wmemcmp(local_98,anon_var_dwarf_fd,5);
          if (iVar4 == 0) {
            wVar19 = L'✓';
            goto LAB_00114757;
          }
          break;
        case 6:
          iVar4 = wmemcmp(local_98,anon_var_dwarf_114,6);
          if (iVar4 == 0) {
            wVar19 = L'✒';
LAB_0011496b:
            iVar4 = 0;
            pwVar17 = (wchar_t *)0x0;
            pwVar18 = (wchar_t *)0x0;
            wVar6 = L'\xffffffff';
          }
          else {
            iVar4 = wmemcmp(pwVar17,anon_var_dwarf_11f,6);
            if (iVar4 != 0) break;
            wVar19 = L'✔';
            iVar4 = 0;
            pwVar17 = (wchar_t *)0x0;
            pwVar18 = (wchar_t *)0x0;
            wVar6 = L'\xffffffff';
          }
LAB_00114971:
          uVar7 = (ulong)(uint)(iVar4 << 4);
          piVar10 = *(int **)((long)local_88 + uVar7);
          piVar2 = *(int **)((long)local_88 + uVar7 + 8);
          wVar20 = L'\0';
          if (piVar10 < piVar2) {
            wVar20 = L'\0';
LAB_00114993:
            iVar4 = *piVar10;
            if (iVar4 < 99) {
              if (iVar4 < 0x44) {
                if (iVar4 == 0x2d) goto LAB_00114a62;
                if (iVar4 == 0x41) {
                  uVar3 = 0x400;
                  goto LAB_00114a5f;
                }
                if (iVar4 != 0x43) goto switchD_001149d2_caseD_71;
                uVar3 = 0x2000;
              }
              else if (iVar4 < 0x57) {
                if (iVar4 == 0x44) {
                  uVar3 = 0x100;
                  goto LAB_00114a5f;
                }
                if (iVar4 != 0x52) goto switchD_001149d2_caseD_71;
                uVar3 = 0x40;
              }
              else if (iVar4 == 0x57) {
                uVar3 = 0x80;
              }
              else {
                if (iVar4 != 0x61) goto switchD_001149d2_caseD_71;
                uVar3 = 0x200;
              }
            }
            else {
              switch(iVar4) {
              case 0x6f:
                uVar3 = 0x4000;
                break;
              case 0x70:
                uVar3 = 0x20;
                break;
              case 0x71:
              case 0x74:
              case 0x75:
              case 0x76:
                goto switchD_001149d2_caseD_71;
              case 0x72:
                uVar3 = 8;
                break;
              case 0x73:
                uVar3 = 0x8000;
                break;
              case 0x77:
                uVar3 = 0x10;
                break;
              case 0x78:
                uVar3 = 1;
                break;
              default:
                if (iVar4 == 99) {
                  uVar3 = 0x1000;
                }
                else {
                  if (iVar4 != 100) goto switchD_001149d2_caseD_71;
                  uVar3 = 0x800;
                }
              }
            }
LAB_00114a5f:
            wVar20 = wVar20 | uVar3;
LAB_00114a62:
            piVar10 = piVar10 + 1;
            local_e0 = wVar20;
            if (piVar2 <= piVar10) goto LAB_00114a74;
            goto LAB_00114993;
          }
LAB_00114a74:
          piVar10 = *(int **)((long)local_88 + uVar7 + 0x10);
          piVar2 = *(int **)((long)local_88 + uVar7 + 0x18);
          if (piVar10 < piVar2) {
LAB_00114a8d:
            iVar4 = *piVar10;
            if (iVar4 < 100) {
              if (iVar4 < 0x49) {
                if (iVar4 != 0x2d) {
                  if (iVar4 == 0x46) {
                    uVar3 = 0x40000000;
                    goto LAB_00114b04;
                  }
                  goto switchD_001149d2_caseD_71;
                }
                goto LAB_00114b07;
              }
              if (iVar4 == 0x49) {
                uVar3 = 0x1000000;
                goto LAB_00114b04;
              }
              if (iVar4 != 0x53) goto switchD_001149d2_caseD_71;
              uVar3 = 0x20000000;
            }
            else if (iVar4 < 0x69) {
              if (iVar4 == 100) {
                uVar3 = 0x4000000;
              }
              else {
                uVar3 = 0x2000000;
                if (iVar4 != 0x66) goto switchD_001149d2_caseD_71;
              }
            }
            else if (iVar4 == 0x69) {
              uVar3 = 0x10000000;
            }
            else {
              if (iVar4 != 0x6e) goto switchD_001149d2_caseD_71;
              uVar3 = 0x8000000;
            }
LAB_00114b04:
            wVar20 = wVar20 | uVar3;
LAB_00114b07:
            piVar10 = piVar10 + 1;
            local_e0 = wVar20;
            if (piVar2 <= piVar10) goto LAB_00114b19;
            goto LAB_00114a8d;
          }
LAB_00114b19:
          pwVar9 = *(wchar_t **)((long)local_88 + uVar7 + 0x20);
          lVar8 = *(long *)((long)alStack_60 + uVar7) - (long)pwVar9;
          if (lVar8 != 0x14) {
            if ((lVar8 == 0x10) &&
               (local_dc = wVar19, local_d8 = pwVar18, local_d0 = pwVar17,
               iVar4 = wmemcmp(pwVar9,anon_var_dwarf_141,4), iVar4 == 0)) {
              wVar19 = L'ࠀ';
              goto LAB_00114c2c;
            }
            goto switchD_0011462a_caseD_1;
          }
          local_dc = wVar19;
          local_d8 = pwVar18;
          local_d0 = pwVar17;
          local_c8 = pwVar9;
          iVar4 = wmemcmp(pwVar9,anon_var_dwarf_14c,5);
          if (iVar4 == 0) {
            wVar19 = L'Ѐ';
          }
          else {
            iVar4 = wmemcmp(local_c8,anon_var_dwarf_157,5);
            if (iVar4 == 0) {
              wVar19 = L'က';
            }
            else {
              iVar4 = wmemcmp(local_c8,anon_var_dwarf_162,5);
              if (iVar4 != 0) goto switchD_0011462a_caseD_1;
              wVar19 = L'\x2000';
            }
          }
LAB_00114c2c:
          puVar11 = *(uint **)((long)alStack_60 + uVar7 + 8);
          puVar1 = *(uint **)((long)alStack_60 + uVar7 + 0x10);
          pwVar17 = local_d8;
          pwVar18 = local_d0;
          wVar13 = local_dc;
          wVar14 = wVar6;
          if (puVar11 < puVar1) {
            wVar15 = L'\0';
            do {
              uVar3 = *puVar11;
              wVar14 = wVar6;
              if (uVar3 - 0x3a < 0xfffffff6) break;
              wVar14 = L'\x7fffffff';
              if ((wVar15 < L'\x0ccccccd') && ((wVar15 != L'\x0ccccccc' || (uVar3 < 0x38)))) {
                wVar14 = uVar3 + wVar15 * 10 + L'\xffffffd0';
              }
              wVar15 = wVar14;
              puVar11 = puVar11 + 1;
              wVar14 = wVar15;
            } while (puVar11 < puVar1);
          }
          goto LAB_00114d38;
        default:
          goto switchD_001144b0_caseD_7;
        case 9:
          iVar4 = wmemcmp(local_98,anon_var_dwarf_12a,9);
          if (iVar4 == 0) {
            wVar19 = L'❻';
            goto LAB_0011496b;
          }
        }
        goto LAB_00114d7b;
      }
      local_c8 = (wchar_t *)0x0;
      wVar19 = local_b8;
      if (*local_98 == L'd') {
        if (uVar22 == 4) {
LAB_001144f5:
          local_c8 = (wchar_t *)0x1;
          wVar19 = L'Ȁ';
        }
        else if ((0x18 < uVar22) &&
                (iVar4 = wmemcmp(local_98 + 1,anon_var_dwarf_97,6), wVar19 = local_b8, iVar4 == 0))
        {
          if (uVar22 == 0x1c) goto LAB_001144f5;
          local_98 = pwVar17 + 7;
          wVar19 = L'Ȁ';
        }
      }
      iVar4 = (int)local_c8;
      uVar7 = (ulong)((iVar4 + 1U) * 0x10);
      pwVar17 = *(wchar_t **)((long)&local_98 + uVar7);
      pwVar18 = *(wchar_t **)((long)&local_90 + uVar7);
      if (pwVar17 < pwVar18) {
        wVar14 = L'\0';
        pwVar9 = pwVar17;
        do {
          wVar6 = *pwVar9;
          if ((uint)(wVar6 + L'\xffffffc6') < 0xfffffff6) goto LAB_00114592;
          wVar20 = L'\x7fffffff';
          if ((wVar14 < L'\x0ccccccd') && ((wVar14 != L'\x0ccccccc' || ((uint)wVar6 < 0x38)))) {
            wVar20 = wVar6 + wVar14 * 10 + L'\xffffffd0';
          }
          wVar14 = wVar20;
          pwVar9 = pwVar9 + 1;
        } while (pwVar9 < pwVar18);
        if (wVar14 == L'\xffffffff') goto LAB_00114592;
      }
      else {
LAB_00114592:
        if (iVar4 + 3U <= uVar3) {
          uVar7 = (ulong)((iVar4 + 3U) * 0x10);
          puVar11 = *(uint **)((long)&local_98 + uVar7);
          puVar1 = *(uint **)((long)&local_90 + uVar7);
          if (puVar11 < puVar1) {
            wVar14 = L'\0';
            do {
              uVar12 = *puVar11;
              if (uVar12 - 0x3a < 0xfffffff6) goto LAB_001145ed;
              wVar6 = L'\x7fffffff';
              if ((wVar14 < L'\x0ccccccd') && ((wVar14 != L'\x0ccccccc' || (uVar12 < 0x38)))) {
                wVar6 = uVar12 + wVar14 * 10 + L'\xffffffd0';
              }
              wVar14 = wVar6;
              puVar11 = puVar11 + 1;
            } while (puVar11 < puVar1);
            goto LAB_001145f3;
          }
        }
LAB_001145ed:
        wVar14 = L'\xffffffff';
      }
LAB_001145f3:
      piVar10 = *(int **)((long)&local_98 + (ulong)(uint)(iVar4 << 4));
      uVar12 = *piVar10 - 0x67U >> 1 | (uint)((*piVar10 - 0x67U & 1) != 0) << 0x1f;
      if (7 < uVar12) goto switchD_0011462a_caseD_1;
      lVar8 = *(long *)((long)&local_90 + (ulong)(uint)(iVar4 << 4)) - (long)piVar10;
      pwVar9 = piVar10 + 1;
      switch(uVar12) {
      case 0:
        wVar6 = L'✔';
        wVar13 = L'✓';
        if (lVar8 == 4) goto LAB_00114912;
        uVar7 = 0xffffffec;
        if (lVar8 == 0x14) {
          local_d8 = pwVar17;
          local_d0 = pwVar18;
          iVar4 = wmemcmp(pwVar9,anon_var_dwarf_fd + 1,4);
          wVar13 = L'✓';
LAB_001148f3:
          uVar7 = 0xffffffec;
          pwVar17 = local_d8;
          pwVar18 = local_d0;
          if (iVar4 == 0) goto LAB_00114912;
        }
        goto switchD_001144b0_caseD_7;
      default:
        goto switchD_0011462a_caseD_1;
      case 3:
        wVar13 = L'✕';
        if (lVar8 != 4) {
          if (lVar8 == 0x10) {
            local_d8 = pwVar17;
            local_d0 = pwVar18;
            iVar5 = wmemcmp(pwVar9,anon_var_dwarf_237 + 1,3);
            wVar13 = L'✕';
LAB_00114802:
            pwVar17 = local_d8;
            pwVar18 = local_d0;
            if (iVar5 == 0) goto LAB_00114819;
          }
          goto switchD_0011462a_caseD_1;
        }
LAB_00114819:
        if (iVar4 + 1U == uVar3) {
          if (pwVar17 < pwVar18) {
            local_dc = wVar13;
            wVar6 = ismode_w(pwVar17,pwVar18,&local_e0);
            wVar13 = local_dc;
            if (wVar6 != L'\0') {
              iVar4 = -1;
              pwVar18 = (wchar_t *)0x0;
              pwVar17 = (wchar_t *)0x0;
              break;
            }
            if ((int)local_c8 + 2U == uVar3) goto switchD_0011462a_caseD_1;
          }
LAB_00114cc5:
          pwVar18 = (wchar_t *)0x0;
          pwVar17 = (wchar_t *)0x0;
          iVar4 = 0;
        }
        else {
          if ((int)local_c8 + 2U != uVar3) goto LAB_00114cc5;
          uVar7 = 0xffffffec;
          if (pwVar17 < pwVar18) goto switchD_001144b0_caseD_7;
          pwVar18 = (wchar_t *)0x0;
          pwVar17 = (wchar_t *)0x0;
          iVar4 = 0;
        }
        break;
      case 4:
        wVar13 = L'✖';
        if (lVar8 == 4) goto LAB_00114819;
        if (lVar8 == 0x14) {
          local_d8 = pwVar17;
          local_d0 = pwVar18;
          iVar5 = wmemcmp(pwVar9,anon_var_dwarf_242 + 1,4);
          wVar13 = L'✖';
          goto LAB_00114802;
        }
        goto switchD_0011462a_caseD_1;
      case 7:
        wVar6 = L'✒';
        wVar13 = L'✑';
        if (lVar8 != 4) {
          uVar7 = 0xffffffec;
          if (lVar8 == 0x10) {
            local_d8 = pwVar17;
            local_d0 = pwVar18;
            iVar4 = wmemcmp(pwVar9,anon_var_dwarf_f2 + 1,3);
            wVar13 = L'✑';
            goto LAB_001148f3;
          }
          goto switchD_001144b0_caseD_7;
        }
LAB_00114912:
        iVar4 = 0;
        if ((pwVar18 <= pwVar17) && (iVar4 = 0, wVar14 == L'\xffffffff')) {
          pwVar18 = (wchar_t *)0x0;
          pwVar17 = (wchar_t *)0x0;
          wVar13 = wVar6;
        }
      }
      uVar7 = 0xffffffec;
      wVar20 = local_e0;
      if ((local_e0 != L'\0') ||
         (uVar22 = (ulong)(iVar4 + (int)local_c8 + 2), local_dc = wVar13, local_d8 = pwVar17,
         local_d0 = pwVar18,
         wVar6 = ismode_w((&local_98)[uVar22 * 2],(wchar_t *)(&local_90)[uVar22 * 2],&local_e0),
         pwVar17 = local_d8, pwVar18 = local_d0, wVar20 = local_e0, wVar13 = local_dc,
         wVar6 != L'\0')) {
LAB_00114d38:
        wVar6 = archive_acl_add_entry_w_len
                          (local_a8,wVar19,wVar20,wVar13,wVar14,pwVar17,
                           (long)pwVar18 - (long)pwVar17 >> 2);
        if (wVar6 < L'\xffffffec') {
          return wVar6;
        }
        uVar7 = local_b0 & 0xffffffff;
        if (wVar6 != L'\0') {
          uVar7 = 0xffffffec;
        }
        local_bc = local_bc | wVar19;
      }
switchD_001144b0_caseD_7:
      goto LAB_00114d7b;
    }
  }
LAB_00114d97:
  archive_acl_reset(local_a8,local_bc);
  return wVar19;
switchD_001149d2_caseD_71:
  local_e0 = wVar20;
switchD_0011462a_caseD_1:
  uVar7 = 0xffffffec;
LAB_00114d7b:
  wVar19 = (wchar_t)uVar7;
  local_b0 = uVar7;
  if (*text == L'\0') goto LAB_00114d97;
  goto LAB_0011437a;
}

Assistant:

int
archive_acl_from_text_w(struct archive_acl *acl, const wchar_t *text,
    int want_type)
{
	struct {
		const wchar_t *start;
		const wchar_t *end;
	} field[6], name;

	const wchar_t *s, *st;

	int numfields, fields, n, r, sol, ret;
	int type, types, tag, permset, id;
	size_t len;
	wchar_t sep;

	ret = ARCHIVE_OK;
	types = 0;

	switch (want_type) {
	case ARCHIVE_ENTRY_ACL_TYPE_POSIX1E:
		want_type = ARCHIVE_ENTRY_ACL_TYPE_ACCESS;
		__LA_FALLTHROUGH;
	case ARCHIVE_ENTRY_ACL_TYPE_ACCESS:
	case ARCHIVE_ENTRY_ACL_TYPE_DEFAULT:
		numfields = 5;
		break;
	case ARCHIVE_ENTRY_ACL_TYPE_NFS4:
		numfields = 6;
		break;
	default:
		return (ARCHIVE_FATAL);
	}

	while (text != NULL && *text != L'\0') {
		/*
		 * Parse the fields out of the next entry,
		 * advance 'text' to start of next entry.
		 */
		fields = 0;
		do {
			const wchar_t *start, *end;
			next_field_w(&text, &start, &end, &sep);
			if (fields < numfields) {
				field[fields].start = start;
				field[fields].end = end;
			}
			++fields;
		} while (sep == L':');

		/* Set remaining fields to blank. */
		for (n = fields; n < numfields; ++n)
			field[n].start = field[n].end = NULL;

		if (field[0].start != NULL && *(field[0].start) == L'#') {
			/* Comment, skip entry */
			continue;
		}

		n = 0;
		sol = 0;
		id = -1;
		permset = 0;
		name.start = name.end = NULL;

		if (want_type != ARCHIVE_ENTRY_ACL_TYPE_NFS4) {
			/* POSIX.1e ACLs */
			/*
			 * Default keyword "default:user::rwx"
			 * if found, we have one more field
			 *
			 * We also support old Solaris extension:
			 * "defaultuser::rwx" is the default ACL corresponding
			 * to "user::rwx", etc. valid only for first field
			 */
			s = field[0].start;
			len = field[0].end - field[0].start;
			if (*s == L'd' && (len == 1 || (len >= 7
			    && wmemcmp((s + 1), L"efault", 6) == 0))) {
				type = ARCHIVE_ENTRY_ACL_TYPE_DEFAULT;
				if (len > 7)
					field[0].start += 7;
				else
					n = 1;
			} else
				type = want_type;

			/* Check for a numeric ID in field n+1 or n+3. */
			isint_w(field[n + 1].start, field[n + 1].end, &id);
			/* Field n+3 is optional. */
			if (id == -1 && fields > n+3)
				isint_w(field[n + 3].start, field[n + 3].end,
				    &id);

			tag = 0;
			s = field[n].start;
			st = field[n].start + 1;
			len = field[n].end - field[n].start;

			switch (*s) {
			case L'u':
				if (len == 1 || (len == 4
				    && wmemcmp(st, L"ser", 3) == 0))
					tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
				break;
			case L'g':
				if (len == 1 || (len == 5
				    && wmemcmp(st, L"roup", 4) == 0))
					tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
				break;
			case L'o':
				if (len == 1 || (len == 5
				    && wmemcmp(st, L"ther", 4) == 0))
					tag = ARCHIVE_ENTRY_ACL_OTHER;
				break;
			case L'm':
				if (len == 1 || (len == 4
				    && wmemcmp(st, L"ask", 3) == 0))
					tag = ARCHIVE_ENTRY_ACL_MASK;
				break;
			default:
					break;
			}

			switch (tag) {
			case ARCHIVE_ENTRY_ACL_OTHER:
			case ARCHIVE_ENTRY_ACL_MASK:
				if (fields == (n + 2)
				    && field[n + 1].start < field[n + 1].end
				    && ismode_w(field[n + 1].start,
				    field[n + 1].end, &permset)) {
					/* This is Solaris-style "other:rwx" */
					sol = 1;
				} else if (fields == (n + 3) &&
				    field[n + 1].start < field[n + 1].end) {
					/* Invalid mask or other field */
					ret = ARCHIVE_WARN;
					continue;
				}
				break;
			case ARCHIVE_ENTRY_ACL_USER_OBJ:
			case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
				if (id != -1 ||
				    field[n + 1].start < field[n + 1].end) {
					name = field[n + 1];
					if (tag == ARCHIVE_ENTRY_ACL_USER_OBJ)
						tag = ARCHIVE_ENTRY_ACL_USER;
					else
						tag = ARCHIVE_ENTRY_ACL_GROUP;
				}
				break;
			default:
				/* Invalid tag, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}

			/*
			 * Without "default:" we expect mode in field 2
			 * Exception: Solaris other and mask fields
			 */
			if (permset == 0 && !ismode_w(field[n + 2 - sol].start,
			    field[n + 2 - sol].end, &permset)) {
				/* Invalid mode, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
		} else {
			/* NFS4 ACLs */
			s = field[0].start;
			len = field[0].end - field[0].start;
			tag = 0;

			switch (len) {
			case 4:
				if (wmemcmp(s, L"user", 4) == 0)
					tag = ARCHIVE_ENTRY_ACL_USER;
				break;
			case 5:
				if (wmemcmp(s, L"group", 5) == 0)
					tag = ARCHIVE_ENTRY_ACL_GROUP;
				break;
			case 6:
				if (wmemcmp(s, L"owner@", 6) == 0)
					tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
				else if (wmemcmp(s, L"group@", len) == 0)
					tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
				break;
			case 9:
				if (wmemcmp(s, L"everyone@", 9) == 0)
					tag = ARCHIVE_ENTRY_ACL_EVERYONE;
			default:
				break;
			}

			if (tag == 0) {
				/* Invalid tag, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			} else if (tag == ARCHIVE_ENTRY_ACL_USER ||
			    tag == ARCHIVE_ENTRY_ACL_GROUP) {
				n = 1;
				name = field[1];
				isint_w(name.start, name.end, &id);
			} else
				n = 0;

			if (!is_nfs4_perms_w(field[1 + n].start,
			    field[1 + n].end, &permset)) {
				/* Invalid NFSv4 perms, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			if (!is_nfs4_flags_w(field[2 + n].start,
			    field[2 + n].end, &permset)) {
				/* Invalid NFSv4 flags, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			s = field[3 + n].start;
			len = field[3 + n].end - field[3 + n].start;
			type = 0;
			if (len == 4) {
				if (wmemcmp(s, L"deny", 4) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_DENY;
			} else if (len == 5) {
				if (wmemcmp(s, L"allow", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_ALLOW;
				else if (wmemcmp(s, L"audit", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_AUDIT;
				else if (wmemcmp(s, L"alarm", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_ALARM;
			}
			if (type == 0) {
				/* Invalid entry type, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			isint_w(field[4 + n].start, field[4 + n].end, &id);
		}

		/* Add entry to the internal list. */
		r = archive_acl_add_entry_w_len(acl, type, permset,
		    tag, id, name.start, name.end - name.start);
		if (r < ARCHIVE_WARN)
			return (r);
		if (r != ARCHIVE_OK)
			ret = ARCHIVE_WARN;
		types |= type;
	}

	/* Reset ACL */
	archive_acl_reset(acl, types);

	return (ret);
}